

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BLBackTrace.cpp
# Opt level: O3

void __thiscall amrex::BLBTer::pop_bt_stack(BLBTer *this)

{
  int iVar1;
  long lVar2;
  
  if (BLBackTrace::bt_stack_abi_cxx11_._48_8_ != BLBackTrace::bt_stack_abi_cxx11_._16_8_) {
    lVar2 = BLBackTrace::bt_stack_abi_cxx11_._48_8_;
    if (BLBackTrace::bt_stack_abi_cxx11_._48_8_ == BLBackTrace::bt_stack_abi_cxx11_._56_8_) {
      lVar2 = *(long *)(BLBackTrace::bt_stack_abi_cxx11_._72_8_ + -8) + 0x200;
    }
    iVar1 = std::__cxx11::string::compare((string *)(lVar2 + -0x20));
    if (iVar1 == 0) {
      std::
      deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pop_back((deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)BLBackTrace::bt_stack_abi_cxx11_);
      return;
    }
  }
  return;
}

Assistant:

void
BLBTer::pop_bt_stack()
{
    if (!BLBackTrace::bt_stack.empty()) {
        if (BLBackTrace::bt_stack.top().second.compare(line_file) == 0) {
            BLBackTrace::bt_stack.pop();
        }
    }
}